

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_file_server.cpp
# Opt level: O0

void __thiscall cppcms::impl::file_server::list_dir(file_server *this,string *url,string *path)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  char *pcVar6;
  int __oflag;
  char *in_RDX;
  char *add;
  port_stat st;
  ostream *out;
  directory d;
  port_stat *in_stack_fffffffffffffc18;
  directory *in_stack_fffffffffffffc20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc28;
  directory *in_stack_fffffffffffffc30;
  char *in_stack_fffffffffffffc38;
  char *in_stack_fffffffffffffc40;
  string *in_stack_fffffffffffffc48;
  string *in_stack_fffffffffffffc58;
  file_server *in_stack_fffffffffffffc60;
  allocator *paVar7;
  allocator local_2f9;
  string local_2f8 [32];
  string local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [32];
  string local_290 [24];
  response *in_stack_fffffffffffffd88;
  char *local_270;
  string local_268 [32];
  string local_248 [56];
  uint local_210;
  long local_1f8;
  long local_1d0;
  string local_178 [32];
  ostream *local_158;
  undefined4 local_150;
  directory local_140;
  char *local_18;
  
  local_18 = in_RDX;
  directory::directory(in_stack_fffffffffffffc20);
  uVar2 = directory::open(&local_140,local_18,__oflag);
  if ((uVar2 & 1) == 0) {
    show404(in_stack_fffffffffffffc60);
    local_150 = 1;
  }
  else {
    application::response((application *)0x3defd4);
    local_158 = http::response::out(in_stack_fffffffffffffd88);
    std::operator<<(local_158,
                    "<!DOCTYPE HTML PUBLIC \"-//W3C//DTD HTML 4.01 Transitional//EN\"\n     \"http://www.w3.org/TR/html4/loose.dtd\">\n"
                   );
    poVar4 = std::operator<<(local_158,
                             "<html><head><title>Directory Listing</title></head>\n<body><h1>Index of "
                            );
    util::escape(in_stack_fffffffffffffc48);
    poVar4 = std::operator<<(poVar4,local_178);
    std::operator<<(poVar4,"</h1>\n");
    std::__cxx11::string::~string(local_178);
    std::ostream::operator<<(local_158,booster::locale::as::gmt);
    std::operator<<(local_158,"<table>\n");
    std::operator<<(local_158,
                    "<thead><tr><td width=\'60%\'>File</td><td width=\'20%\' >Date</td><td width=\'5%\'>&nbsp;</td><td width=\'15%\'>Size</td></tr></thead>\n<tbody>\n"
                   );
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffc20,(char *)in_stack_fffffffffffffc18);
    if ((bVar1) && (uVar5 = std::__cxx11::string::empty(), (uVar5 & 1) == 0)) {
      std::operator<<(local_158,
                      "<tr><td><code><a href=\'../\' >..</a></code></td><td>&nbsp;</td><td>&nbsp;</td><td>&nbsp;</td></tr>\n"
                     );
    }
    booster::locale::as::ftime<char>(in_stack_fffffffffffffc38);
    booster::locale::as::details::operator<<
              ((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffc20,
               (add_ftime<char> *)in_stack_fffffffffffffc18);
    booster::locale::as::details::add_ftime<char>::~add_ftime((add_ftime<char> *)0x3df197);
LAB_003df197:
    bVar1 = directory::next(in_stack_fffffffffffffc30);
    if (bVar1) {
      pcVar6 = directory::name(&local_140);
      iVar3 = memcmp(pcVar6,".",1);
      if (iVar3 != 0) {
        std::operator+(in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
        directory::name(&local_140);
        std::operator+(in_stack_fffffffffffffc28,(char *)in_stack_fffffffffffffc20);
        std::__cxx11::string::c_str();
        iVar3 = anon_unknown_5::get_stat
                          ((char *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
        std::__cxx11::string::~string(local_248);
        std::__cxx11::string::~string(local_268);
        if (-1 < iVar3) {
          local_270 = "\x01";
          if ((local_210 & 0x4000) == 0) {
            if ((local_210 & 0x8000) == 0) goto LAB_003df197;
          }
          else {
            local_270 = "(/";
          }
          local_270 = local_270 + 1;
          std::operator<<(local_158,"<tr>");
          poVar4 = std::operator<<(local_158,"<td><code><a href=\'");
          pcVar6 = directory::name(&local_140);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2b0,pcVar6,&local_2b1);
          util::urlencode(in_stack_fffffffffffffc58);
          poVar4 = std::operator<<(poVar4,local_290);
          poVar4 = std::operator<<(poVar4,local_270);
          poVar4 = std::operator<<(poVar4,"\'>");
          pcVar6 = directory::name(&local_140);
          paVar7 = &local_2f9;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2f8,pcVar6,paVar7);
          util::escape(in_stack_fffffffffffffc48);
          in_stack_fffffffffffffc58 = (string *)std::operator<<(poVar4,local_2d8);
          poVar4 = std::operator<<((ostream *)in_stack_fffffffffffffc58,local_270);
          std::operator<<(poVar4,"</a></code></td>");
          std::__cxx11::string::~string(local_2d8);
          std::__cxx11::string::~string(local_2f8);
          std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
          std::__cxx11::string::~string(local_290);
          std::__cxx11::string::~string(local_2b0);
          std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
          in_stack_fffffffffffffc48 = (string *)std::operator<<(local_158,"<td>");
          in_stack_fffffffffffffc40 =
               (char *)std::ostream::operator<<
                                 (in_stack_fffffffffffffc48,booster::locale::as::strftime);
          poVar4 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffc40,local_1d0);
          std::operator<<(poVar4,"</td><td>&nbsp;</td>");
          if ((local_210 & 0x8000) == 0) {
            std::operator<<(local_158,"<td> <strong>-</strong> </td>");
          }
          else {
            in_stack_fffffffffffffc30 = (directory *)std::operator<<(local_158,"<td>");
            in_stack_fffffffffffffc28 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::ostream::operator<<(in_stack_fffffffffffffc30,booster::locale::as::number);
            in_stack_fffffffffffffc20 =
                 (directory *)std::ostream::operator<<(in_stack_fffffffffffffc28,local_1f8);
            std::operator<<((ostream *)in_stack_fffffffffffffc20,"</td>");
          }
          std::operator<<(local_158,"</tr>\n");
        }
      }
      goto LAB_003df197;
    }
    std::operator<<(local_158,"</tbody>\n</table>\n");
    std::operator<<(local_158,"<p>CppCMS-Embedded/2.0.0.beta2</p>\n");
    std::operator<<(local_158,"</body>\n");
    local_150 = 0;
  }
  directory::~directory(in_stack_fffffffffffffc20);
  return;
}

Assistant:

void file_server::list_dir(std::string const &url,std::string const &path)
{
	cppcms::impl::directory d;
	if(!d.open(path)) {
		show404();
		return;
	}
	
#ifdef CPPCMS_WIN_NATIVE
	response().content_type("text/html; charset=UTF-8");
#endif
	std::ostream &out = response().out();
	out << "<!DOCTYPE HTML PUBLIC \"-//W3C//DTD HTML 4.01 Transitional//EN\"\n"
	       "     \"http://www.w3.org/TR/html4/loose.dtd\">\n";

	out << "<html><head><title>Directory Listing</title></head>\n"
		"<body><h1>Index of " << util::escape(url) << "</h1>\n";
	out << booster::locale::as::gmt;
	//out <<"<table cellpadding='0' cellspacing='2' border='0' >\n";
	out <<"<table>\n";
	out <<"<thead><tr><td width='60%'>File</td><td width='20%' >Date</td><td width='5%'>&nbsp;</td><td width='15%'>Size</td></tr></thead>\n"
		"<tbody>\n";
	if(url!="/" && !url.empty()) {
		out << "<tr><td><code><a href='../' >..</a></code></td><td>&nbsp;</td><td>&nbsp;</td><td>&nbsp;</td></tr>\n";
	}
	out << booster::locale::as::ftime("%Y-%m-%d %H:%M:%S");
	while(d.next()) {
		if(memcmp(d.name(),".",1) == 0)
			continue;
		port_stat st;
		if(get_stat((path + "/" + d.name()).c_str(),&st) < 0)
			continue;
		char const *add="";
		if(st.st_mode & S_IFDIR)
			add="/";
		else if(st.st_mode & S_IFREG)
			;
		else 
			continue;
		out << "<tr>";
		out << "<td><code><a href='" 
			<< util::urlencode(d.name()) << add << "'>" << util::escape(d.name()) << add << "</a></code></td>";
		out << "<td>" << booster::locale::as::strftime << st.st_mtime <<"</td><td>&nbsp;</td>";
		if(st.st_mode & S_IFREG)
			out << "<td>" << booster::locale::as::number << st.st_size <<"</td>";
		else
			out << "<td> <strong>-</strong> </td>";
		out <<"</tr>\n";
	}
	out <<"</tbody>\n</table>\n";
	out <<"<p>CppCMS-Embedded/" CPPCMS_PACKAGE_VERSION "</p>\n";
	out <<"</body>\n";
}